

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

bool checkDockWidgetArea(DockWidgetArea area,char *where)

{
  char *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd4;
  bool bVar1;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_EDI - 1U < 2) || (in_EDI == 4)) || (in_EDI == 8)) {
    bVar1 = true;
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffffd4,in_EDI),in_RSI,in_EDI,
               in_stack_ffffffffffffffb8);
    QMessageLogger::warning(local_28,"%s: invalid \'area\' argument",in_RSI);
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

static bool checkDockWidgetArea(Qt::DockWidgetArea area, const char *where)
{
    switch (area) {
    case Qt::LeftDockWidgetArea:
    case Qt::RightDockWidgetArea:
    case Qt::TopDockWidgetArea:
    case Qt::BottomDockWidgetArea:
        return true;
    default:
        break;
    }
    qWarning("%s: invalid 'area' argument", where);
    return false;
}